

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O0

int lj_cf_debug_sethook(lua_State *L)

{
  TValue *pTVar1;
  int iVar2;
  char *smask_00;
  lua_Integer lVar3;
  char *smask;
  lua_Hook func;
  int local_18;
  int count;
  int mask;
  int arg;
  lua_State *L_local;
  
  _mask = L;
  getthread(L,&count);
  iVar2 = lua_type(_mask,count + 1);
  if (iVar2 < 1) {
    lua_settop(_mask,count + 1);
    smask = (char *)0x0;
    local_18 = 0;
    func._4_4_ = 0;
  }
  else {
    smask_00 = luaL_checklstring(_mask,count + 2,(size_t *)0x0);
    luaL_checktype(_mask,count + 1,6);
    lVar3 = luaL_optinteger(_mask,count + 3,0);
    func._4_4_ = (int)lVar3;
    smask = (char *)hookf;
    local_18 = makemask(smask_00,func._4_4_);
  }
  pTVar1 = _mask->top;
  _mask->top = pTVar1 + 1;
  pTVar1->n = -5.13828271674896e-322;
  lua_pushvalue(_mask,count + 1);
  lua_rawset(_mask,-10000);
  lua_sethook(_mask,(lua_Hook)smask,local_18,func._4_4_);
  return 0;
}

Assistant:

LJLIB_CF(debug_sethook)
{
  int arg, mask, count;
  lua_Hook func;
  (void)getthread(L, &arg);
  if (lua_isnoneornil(L, arg+1)) {
    lua_settop(L, arg+1);
    func = NULL; mask = 0; count = 0;  /* turn off hooks */
  } else {
    const char *smask = luaL_checkstring(L, arg+2);
    luaL_checktype(L, arg+1, LUA_TFUNCTION);
    count = luaL_optint(L, arg+3, 0);
    func = hookf; mask = makemask(smask, count);
  }
  (L->top++)->u64 = KEY_HOOK;
  lua_pushvalue(L, arg+1);
  lua_rawset(L, LUA_REGISTRYINDEX);
  lua_sethook(L, func, mask, count);
  return 0;
}